

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O0

int verify_descriptor_wsh(miniscript_node_t *node,miniscript_node_t *parent)

{
  _Bool _Var1;
  int32_t iVar2;
  miniscript_node_t *parent_local;
  miniscript_node_t *node_local;
  
  if ((parent == (miniscript_node_t *)0x0) ||
     ((parent->info != (miniscript_item_t *)0x0 && (parent->info->kind == 0x502)))) {
    iVar2 = get_child_list_count(node);
    if ((iVar2 == node->info->inner_num) && (node->child->info != (miniscript_item_t *)0x0)) {
      _Var1 = has_uncompressed_key_by_child(node);
      if (_Var1) {
        node_local._4_4_ = -2;
      }
      else {
        node->type_properties = node->child->type_properties;
        node_local._4_4_ = 0;
      }
    }
    else {
      node_local._4_4_ = -2;
    }
  }
  else {
    node_local._4_4_ = -2;
  }
  return node_local._4_4_;
}

Assistant:

static int verify_descriptor_wsh(struct miniscript_node_t *node, struct miniscript_node_t *parent)
{
    if (parent && (!parent->info || (parent->info->kind != DESCRIPTOR_KIND_DESCRIPTOR_SH)))
        return WALLY_EINVAL;
    if ((get_child_list_count(node) != node->info->inner_num) || !node->child->info)
        return WALLY_EINVAL;
    if (has_uncompressed_key_by_child(node))
        return WALLY_EINVAL;

    node->type_properties = node->child->type_properties;
    return WALLY_OK;
}